

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O2

int __thiscall QTabWidgetPrivate::init(QTabWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *parent;
  TabPosition pos;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  aVar1.m_data = operator_new(0x28);
  QStackedWidget::QStackedWidget((QStackedWidget *)aVar1.m_data,parent);
  this->stack = (QStackedWidget *)aVar1;
  QVar3.m_size = (size_t)"qt_tabwidget_stackedwidget";
  QVar3.field_0.m_data = aVar1.m_data;
  QObject::setObjectName(QVar3);
  QFrame::setLineWidth(&this->stack->super_QFrame,0);
  QWidget::setSizePolicy((QWidget *)this->stack,(QSizePolicy)0xd550000);
  QObjectPrivate::connect<void(QStackedWidget::*)(int),void(QTabWidgetPrivate::*)(int)>
            ((Object *)&stack0xffffffffffffffc8,(offset_in_QStackedWidget_to_subr)this->stack,
             (Object *)QStackedWidget::widgetRemoved,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc8);
  aVar1.m_data = operator_new(0x28);
  QTabBar::QTabBar((QTabBar *)aVar1.m_data,parent);
  QVar4.m_size = (size_t)"qt_tabwidget_tabbar";
  QVar4.field_0.m_data = aVar1.m_data;
  QObject::setObjectName(QVar4);
  QTabBar::setDrawBase((QTabBar *)aVar1.m_data,false);
  QTabWidget::setTabBar((QTabWidget *)parent,(QTabBar *)aVar1.m_data);
  QWidget::setSizePolicy(parent,(QSizePolicy)0xd770000);
  QWidget::setFocusPolicy(parent,TabFocus);
  QWidget::setFocusProxy(parent,&this->tabs->super_QWidget);
  pQVar2 = QWidget::style(parent);
  pos = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x56,0,parent,0);
  QTabWidget::setTabPosition((QTabWidget *)parent,pos);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTabWidgetPrivate::init()
{
    Q_Q(QTabWidget);

    stack = new QStackedWidget(q);
    stack->setObjectName("qt_tabwidget_stackedwidget"_L1);
    stack->setLineWidth(0);
    // hack so that QMacStyle::layoutSpacing() can detect tab widget pages
    stack->setSizePolicy(QSizePolicy(QSizePolicy::Preferred, QSizePolicy::Preferred, QSizePolicy::TabWidget));

    QObjectPrivate::connect(stack, &QStackedWidget::widgetRemoved, this, &QTabWidgetPrivate::removeTab);
    QTabBar *tabBar = new QTabBar(q);
    tabBar->setObjectName("qt_tabwidget_tabbar"_L1);
    tabBar->setDrawBase(false);
    q->setTabBar(tabBar);

    q->setSizePolicy(QSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding,
                                 QSizePolicy::TabWidget));
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled())
        q->setFocusPolicy(Qt::NoFocus);
    else
#endif
    q->setFocusPolicy(Qt::TabFocus);
    q->setFocusProxy(tabs);
    q->setTabPosition(static_cast<QTabWidget::TabPosition> (q->style()->styleHint(
                      QStyle::SH_TabWidget_DefaultTabPosition, nullptr, q )));

}